

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::MeshLoader::begin__triangles
          (MeshLoader *this,triangles__AttributeData *attributeData)

{
  GeometryMaterialIdInfo *this_00;
  MeshPrimitive *pMVar1;
  MaterialId MVar2;
  allocator<char> local_41;
  String local_40;
  
  this->mCurrentPrimitiveType = TRIANGLES;
  pMVar1 = (MeshPrimitive *)operator_new(0x118);
  IFilePartLoader::createUniqueId((UniqueId *)&local_40,(IFilePartLoader *)this,PRIMITIVE_ELEMENT);
  COLLADAFW::MeshPrimitive::MeshPrimitive(pMVar1,(UniqueId *)&local_40,TRIANGLES);
  (pMVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>).super_Object._vptr_Object =
       (_func_int **)&PTR__MeshPrimitive_009dcab0;
  this->mCurrentMeshPrimitive = pMVar1;
  COLLADAFW::UniqueId::~UniqueId((UniqueId *)&local_40);
  if (attributeData->count != 0) {
    COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
              (&this->mCurrentMeshPrimitive->mPositionIndices,attributeData->count);
    if (this->mUseNormals == true) {
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (&this->mCurrentMeshPrimitive->mNormalIndices,attributeData->count);
    }
    if (this->mUseTangents == true) {
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (&this->mCurrentMeshPrimitive->mTangentIndices,attributeData->count);
    }
    if (this->mUseBinormals == true) {
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (&this->mCurrentMeshPrimitive->mBinormalIndices,attributeData->count);
    }
  }
  if (attributeData->material != (char *)0x0) {
    this_00 = this->mMaterialIdInfo;
    pMVar1 = this->mCurrentMeshPrimitive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    MVar2 = GeometryMaterialIdInfo::getMaterialId(this_00,&local_40);
    pMVar1->mMaterialId = MVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pMVar1 = this->mCurrentMeshPrimitive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    std::__cxx11::string::_M_assign((string *)&pMVar1->mMaterial);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool MeshLoader::begin__triangles( const triangles__AttributeData& attributeData )
	{
		mCurrentPrimitiveType = TRIANGLES;
		mCurrentMeshPrimitive = new COLLADAFW::Triangles(createUniqueId(COLLADAFW::Triangles::ID()));
		if ( (size_t)attributeData.count > 0)
		{
			mCurrentMeshPrimitive->getPositionIndices().reallocMemory((size_t)attributeData.count);
			if ( mUseNormals )
			{
				mCurrentMeshPrimitive->getNormalIndices().reallocMemory((size_t)attributeData.count);
			}

            if ( mUseTangents )
            {
                mCurrentMeshPrimitive->getTangentIndices().reallocMemory((size_t)attributeData.count);
            }

            if ( mUseBinormals )
            {
                mCurrentMeshPrimitive->getBinormalIndices().reallocMemory((size_t)attributeData.count);
            }

			// TODO pre-alloc memory for uv indices
		}
		if ( attributeData.material )
		{
			mCurrentMeshPrimitive->setMaterialId(mMaterialIdInfo.getMaterialId(attributeData.material));
			mCurrentMeshPrimitive->setMaterial(attributeData.material);
		}
		return true;
	}